

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteBool(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this,bool b)

{
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar1;
  char *pcVar2;
  char *pcVar3;
  undefined7 in_register_00000031;
  Stack<rapidjson::CrtAllocator> *this_00;
  
  this_00 = &this->os_->stack_;
  pcVar2 = this_00->stackTop_;
  pcVar3 = this_00->stackEnd_;
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    if (pcVar3 < pcVar2 + 5) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,5);
      this_00 = &this->os_->stack_;
      pcVar2 = this_00->stackTop_;
      pcVar3 = this_00->stackEnd_;
    }
    if (pcVar3 < pcVar2 + 1) goto LAB_0047e6bf;
    this_00->stackTop_ = pcVar2 + 1;
    *pcVar2 = 'f';
    pGVar1 = this->os_;
    pcVar3 = (pGVar1->stack_).stackTop_;
    pcVar2 = pcVar3 + 1;
    if ((pGVar1->stack_).stackEnd_ < pcVar2) goto LAB_0047e6bf;
    (pGVar1->stack_).stackTop_ = pcVar2;
    *pcVar3 = 'a';
    pGVar1 = this->os_;
    pcVar3 = (pGVar1->stack_).stackTop_;
    pcVar2 = pcVar3 + 1;
    if ((pGVar1->stack_).stackEnd_ < pcVar2) goto LAB_0047e6bf;
    (pGVar1->stack_).stackTop_ = pcVar2;
    *pcVar3 = 'l';
    pGVar1 = this->os_;
    pcVar3 = (pGVar1->stack_).stackTop_;
    pcVar2 = pcVar3 + 1;
    if ((pGVar1->stack_).stackEnd_ < pcVar2) goto LAB_0047e6bf;
    (pGVar1->stack_).stackTop_ = pcVar2;
    *pcVar3 = 's';
  }
  else {
    if (pcVar3 < pcVar2 + 4) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,4);
      this_00 = &this->os_->stack_;
      pcVar2 = this_00->stackTop_;
      pcVar3 = this_00->stackEnd_;
    }
    if (pcVar3 < pcVar2 + 1) goto LAB_0047e6bf;
    this_00->stackTop_ = pcVar2 + 1;
    *pcVar2 = 't';
    pGVar1 = this->os_;
    pcVar3 = (pGVar1->stack_).stackTop_;
    pcVar2 = pcVar3 + 1;
    if ((pGVar1->stack_).stackEnd_ < pcVar2) goto LAB_0047e6bf;
    (pGVar1->stack_).stackTop_ = pcVar2;
    *pcVar3 = 'r';
    pGVar1 = this->os_;
    pcVar3 = (pGVar1->stack_).stackTop_;
    pcVar2 = pcVar3 + 1;
    if ((pGVar1->stack_).stackEnd_ < pcVar2) goto LAB_0047e6bf;
    (pGVar1->stack_).stackTop_ = pcVar2;
    *pcVar3 = 'u';
  }
  pGVar1 = this->os_;
  pcVar3 = (pGVar1->stack_).stackTop_;
  pcVar2 = pcVar3 + 1;
  if (pcVar2 <= (pGVar1->stack_).stackEnd_) {
    (pGVar1->stack_).stackTop_ = pcVar2;
    *pcVar3 = 'e';
    return true;
  }
LAB_0047e6bf:
  __assert_fail("stackTop_ + sizeof(T) * count <= stackEnd_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/stack.h"
                ,0x81,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
               );
}

Assistant:

bool WriteBool(bool b)  {
        if (b) {
            PutReserve(*os_, 4);
            PutUnsafe(*os_, 't'); PutUnsafe(*os_, 'r'); PutUnsafe(*os_, 'u'); PutUnsafe(*os_, 'e');
        }
        else {
            PutReserve(*os_, 5);
            PutUnsafe(*os_, 'f'); PutUnsafe(*os_, 'a'); PutUnsafe(*os_, 'l'); PutUnsafe(*os_, 's'); PutUnsafe(*os_, 'e');
        }
        return true;
    }